

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall helics::apps::App::~App(App *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->_vptr_App = (_func_int **)&PTR__App_004c90f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->remArgs);
  pcVar2 = (this->outFileName)._M_dataplus._M_p;
  paVar1 = &(this->outFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->inputFileName)._M_dataplus._M_p;
  paVar1 = &(this->inputFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->configFileName)._M_dataplus._M_p;
  paVar1 = &(this->configFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

std::unique_ptr<helicsCLI11App> App::generateParser()
{
    auto app =
        std::make_unique<helicsCLI11App>("Common options for all Helics Apps", "[HELICS_APP]");
    app->add_config_validation();
    app->add_flag("--local",
                  useLocal,
                  "Specify otherwise unspecified endpoints and publications as local "
                  "(i.e. the names will be prepended with the app name)");
    app->add_option("--stop", stopTime, "The time to stop the app");
    app->add_option("--input,input",
                    inputFileName,
                    "The primary input file containing app configuration")
        ->check(CLI::ExistingFile);
    app->add_option("--output,-o", outFileName, "the output file for recording the data")
        ->capture_default_str();
    app->allow_extras()->validate_positionals();
    return app;
}